

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

CodecFactory ** __thiscall
testing::internal::ValuesInIteratorRangeGenerator<const_libaom_test::CodecFactory_*>::Iterator::
Current(Iterator *this)

{
  pointer ppCVar1;
  undefined8 *puVar2;
  reference ppCVar3;
  long in_RDI;
  pointer in_stack_ffffffffffffffd8;
  unique_ptr<const_libaom_test::CodecFactory_*const,_std::default_delete<const_libaom_test::CodecFactory_*const>_>
  *in_stack_ffffffffffffffe0;
  
  ppCVar1 = std::
            unique_ptr<const_libaom_test::CodecFactory_*const,_std::default_delete<const_libaom_test::CodecFactory_*const>_>
            ::get(in_stack_ffffffffffffffe0);
  if (ppCVar1 == (pointer)0x0) {
    in_stack_ffffffffffffffe0 =
         (unique_ptr<const_libaom_test::CodecFactory_*const,_std::default_delete<const_libaom_test::CodecFactory_*const>_>
          *)(in_RDI + 0x18);
    puVar2 = (undefined8 *)operator_new(8);
    ppCVar3 = __gnu_cxx::
              __normal_iterator<const_libaom_test::CodecFactory_*const_*,_std::vector<const_libaom_test::CodecFactory_*,_std::allocator<const_libaom_test::CodecFactory_*>_>_>
              ::operator*((__normal_iterator<const_libaom_test::CodecFactory_*const_*,_std::vector<const_libaom_test::CodecFactory_*,_std::allocator<const_libaom_test::CodecFactory_*>_>_>
                           *)(in_RDI + 0x10));
    *puVar2 = *ppCVar3;
    std::
    unique_ptr<const_libaom_test::CodecFactory_*const,_std::default_delete<const_libaom_test::CodecFactory_*const>_>
    ::reset(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  ppCVar1 = std::
            unique_ptr<const_libaom_test::CodecFactory_*const,_std::default_delete<const_libaom_test::CodecFactory_*const>_>
            ::get(in_stack_ffffffffffffffe0);
  return ppCVar1;
}

Assistant:

const T* Current() const override {
      if (value_.get() == nullptr) value_.reset(new T(*iterator_));
      return value_.get();
    }